

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  curl_trc_feat *pcVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  timediff_t timeout_ms;
  uint *puVar8;
  ulong uVar9;
  int iVar10;
  Curl_cfilter *cf;
  Curl_cfilter *cf_00;
  _Bool done;
  
  if (data->conn == (connectdata *)0x0) {
    cf = (Curl_cfilter *)0x0;
    cf_00 = cf;
  }
  else {
    cf = data->conn->cfilter[sockindex];
    cf_00 = cf;
  }
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (cf->cft == &Curl_cft_ssl) break;
    cf = cf->next;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_cft_ssl.log_level)) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, start");
  }
  uVar6 = 0;
  Curl_shutdown_start(data,sockindex,0,(curltime *)0x0);
  if ((cf->field_0x24 & 2) == 0) {
    plVar2 = (long *)cf->ctx;
    lVar3 = plVar2[9];
    plVar2[9] = (long)data;
    bVar4 = false;
    for (iVar10 = -10; iVar10 != 0; iVar10 = iVar10 + 1) {
      timeout_ms = Curl_shutdown_timeleft(cf->conn,cf->sockindex,(curltime *)0x0);
      if (timeout_ms < 0) {
        Curl_failf(data,"SSL shutdown timeout");
        uVar6 = 0x1c;
        goto LAB_0016ea2f;
      }
      uVar6 = (**(code **)(*plVar2 + 0x38))(cf,data,send_shutdown);
      if (uVar6 != 0) {
LAB_0016ea0a:
        *(long *)((long)cf->ctx + 0x48) = lVar3;
        bVar5 = 2;
        goto LAB_0016ea19;
      }
      if (*(int *)((long)plVar2 + 0xc4) != 0) {
        iVar7 = Curl_conn_cf_poll(cf,data,timeout_ms);
        if (iVar7 < 0) {
          puVar8 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar8);
          uVar6 = 0x38;
        }
        else {
          if (iVar7 != 0) goto LAB_0016e991;
          Curl_failf(data,"SSL shutdown timeout");
          uVar6 = 0x1c;
        }
        goto LAB_0016ea0a;
      }
LAB_0016e991:
    }
    *(long *)((long)cf->ctx + 0x48) = lVar3;
    bVar5 = 0;
    uVar6 = 0;
LAB_0016ea19:
    cf->field_0x24 = cf->field_0x24 & 0xfd | bVar5;
  }
  else {
    bVar4 = true;
  }
LAB_0016ea2f:
  Curl_shutdown_clear(data,sockindex);
  uVar9 = 0x50;
  if (bVar4) {
    uVar9 = 0;
  }
  if (uVar6 != 0) {
    uVar9 = (ulong)uVar6;
  }
  Curl_conn_cf_discard_sub(cf_00,cf,data,false);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, done -> %d",uVar9);
  }
  return (CURLcode)uVar9;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn ? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, 0, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}